

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O0

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:310:32)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_std::error_code>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_asio::system_executor>
  w;
  ptr p;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32)>
  *h;
  undefined4 in_stack_ffffffffffffff88;
  half_t in_stack_ffffffffffffff8c;
  gcc_x86_fenced_block *in_stack_ffffffffffffff90;
  undefined1 local_60 [16];
  ptr *in_stack_ffffffffffffffb0;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_asio::system_executor>
  local_41;
  undefined1 *local_40;
  long local_28;
  long local_8;
  
  local_40 = (undefined1 *)(in_RSI + 0x28);
  local_28 = in_RSI;
  local_8 = in_RDI;
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:310:32),_asio::system_executor>
  ::handler_work(&local_41,(anon_class_8_1_8991fb9c *)(in_RSI + 0x28));
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:310:32),_std::error_code>
  ::binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_std::error_code>
             *)local_60,(anon_class_8_1_8991fb9c *)(local_28 + 0x28),(error_code *)(local_28 + 0x18)
           );
  local_40 = local_60;
  ptr::reset(in_stack_ffffffffffffffb0);
  if (local_8 != 0) {
    gcc_x86_fenced_block::gcc_x86_fenced_block(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    handler_work<mau::DeliveryChannel::postNextTimer()::$_0,asio::system_executor>::
    complete<asio::detail::binder1<mau::DeliveryChannel::postNextTimer()::__0,std::error_code>>
              ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_asio::system_executor>
                *)in_stack_ffffffffffffff90,
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:310:32),_std::error_code>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (anon_class_8_1_8991fb9c *)0x26b811);
    gcc_x86_fenced_block::~gcc_x86_fenced_block(in_stack_ffffffffffffff90);
  }
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:310:32),_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x26b85d);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }